

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

size_t cmsys::SystemTools::CountChar(char *str,char c)

{
  size_t sVar1;
  
  sVar1 = 0;
  if (str != (char *)0x0) {
    for (; *str != '\0'; str = str + 1) {
      sVar1 = sVar1 + (*str == c);
    }
  }
  return sVar1;
}

Assistant:

size_t SystemTools::CountChar(const char* str, char c)
{
  size_t count = 0;

  if (str) {
    while (*str) {
      if (*str == c) {
        ++count;
      }
      ++str;
    }
  }
  return count;
}